

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_get_cursor_in_seconds(ma_data_source *pDataSource,float *pCursor)

{
  float *in_RSI;
  ma_uint32 *in_RDI;
  ma_format *unaff_retaddr;
  ma_data_source *in_stack_00000008;
  ma_uint32 sampleRate;
  ma_uint64 cursorInPCMFrames;
  ma_result result;
  uint local_2c;
  long local_28;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_result mVar1;
  
  if (in_RSI == (float *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0.0;
    mVar1 = ma_data_source_get_cursor_in_pcm_frames
                      (in_RSI,(ma_uint64 *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if ((mVar1 == MA_SUCCESS) &&
       (mVar1 = ma_data_source_get_data_format
                          (in_stack_00000008,unaff_retaddr,
                           (ma_uint32 *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           (ma_channel *)in_RSI,(ulong)in_stack_ffffffffffffffe0),
       mVar1 == MA_SUCCESS)) {
      *in_RSI = (float)local_28 / (float)local_2c;
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_get_cursor_in_seconds(ma_data_source* pDataSource, float* pCursor)
{
    ma_result result;
    ma_uint64 cursorInPCMFrames;
    ma_uint32 sampleRate;

    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    result = ma_data_source_get_cursor_in_pcm_frames(pDataSource, &cursorInPCMFrames);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* VC6 does not support division of unsigned 64-bit integers with floating point numbers. Need to use a signed number. This shouldn't effect anything in practice. */
    *pCursor = (ma_int64)cursorInPCMFrames / (float)sampleRate;

    return MA_SUCCESS;
}